

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O2

domain_manager * __thiscall
cs::domain_manager::add_buildin_var<char_const(&)[11]>
          (domain_manager *this,char (*name) [11],var *var)

{
  domain_manager *pdVar1;
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,*name,&local_41);
  add_record(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::emplace<const_char_(&)[11],_0>
            ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
              *)&local_40,
             &(this->buildin_symbols).
              super_raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ,name);
  pdVar1 = add_var_global<char_const(&)[11]>(this,name,var);
  return pdVar1;
}

Assistant:

domain_manager &add_buildin_var(T &&name, const var &var)
		{
			add_record(name);
			buildin_symbols.emplace(name);
			return add_var_global(name, var);
		}